

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O3

uint64_t MurmurHash64A(void *key,int len,uint64_t seed)

{
  uint uVar1;
  ulong uVar2;
  byte *pbVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = (long)len * -0x395b586ca42e166b ^ seed;
  uVar1 = len;
  if (len < 0) {
    uVar1 = len + 7U;
  }
  pbVar3 = (byte *)key;
  if (0xe < len + 7U) {
    pbVar3 = (byte *)((long)key + (long)((int)uVar1 >> 3) * 8);
    lVar4 = 0;
    do {
      uVar5 = *(long *)((long)key + lVar4) * -0x395b586ca42e166b;
      uVar2 = (uVar2 ^ (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      lVar4 = lVar4 + 8;
    } while ((long)((int)uVar1 >> 3) * 8 != lVar4);
  }
  switch(len & 7) {
  case 7:
    uVar2 = uVar2 ^ (ulong)pbVar3[6] << 0x30;
  case 6:
    uVar2 = uVar2 ^ (ulong)pbVar3[5] << 0x28;
  case 5:
    uVar2 = uVar2 ^ (ulong)pbVar3[4] << 0x20;
  case 4:
    uVar2 = uVar2 ^ (ulong)pbVar3[3] << 0x18;
  case 3:
    uVar2 = uVar2 ^ (ulong)pbVar3[2] << 0x10;
  case 2:
    uVar2 = uVar2 ^ (ulong)pbVar3[1] << 8;
  case 1:
    uVar2 = (*pbVar3 ^ uVar2) * -0x395b586ca42e166b;
  case 0:
    uVar2 = (uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b;
    return uVar2 >> 0x2f ^ uVar2;
  }
}

Assistant:

uint64_t MurmurHash64A(const void* key, int len, uint64_t seed)
{
	const uint64_t m = BIG_CONSTANT(0xc6a4a7935bd1e995);
	const int r = 47;

	uint64_t h = seed ^ (len * m);

	const uint64_t* data = (const uint64_t*)key;
	const uint64_t* end = data + (len / 8);

	while (data != end)
	{
		uint64_t k = *data++;

		k *= m;
		k ^= k >> r;
		k *= m;

		h ^= k;
		h *= m;
	}

	const unsigned char* data2 = (const unsigned char*)data;

	switch (len & 7)
	{
	case 7: h ^= (uint64_t)(data2[6]) << 48;
	case 6: h ^= (uint64_t)(data2[5]) << 40;
	case 5: h ^= (uint64_t)(data2[4]) << 32;
	case 4: h ^= (uint64_t)(data2[3]) << 24;
	case 3: h ^= (uint64_t)(data2[2]) << 16;
	case 2: h ^= (uint64_t)(data2[1]) << 8;
	case 1: h ^= (uint64_t)(data2[0]);
		h *= m;
	};

	h ^= h >> r;
	h *= m;
	h ^= h >> r;

	return h;
}